

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall
QPDF::processFile(QPDF *this,char *description,FILE *filep,bool close_file,char *password)

{
  FileInputSource *this_00;
  __shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (FileInputSource *)operator_new(0xd8);
  FileInputSource::FileInputSource(this_00,description,filep,close_file);
  std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileInputSource,void>
            (local_40,this_00);
  processInputSource(this,(shared_ptr<InputSource> *)local_40,password);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void
QPDF::processFile(char const* description, FILE* filep, bool close_file, char const* password)
{
    auto* fi = new FileInputSource(description, filep, close_file);
    processInputSource(std::shared_ptr<InputSource>(fi), password);
}